

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumePadding
          (ParsedPatternInfo *this,PadPosition paddingLocation,UErrorCode *status)

{
  UChar32 UVar1;
  UErrorCode *status_local;
  PadPosition paddingLocation_local;
  ParsedPatternInfo *this_local;
  
  UVar1 = ParserState::peek(&this->state);
  if (UVar1 == 0x2a) {
    if ((this->currentSubpattern->hasPadding & 1U) == 0) {
      this->currentSubpattern->paddingLocation = paddingLocation;
      this->currentSubpattern->hasPadding = true;
      ParserState::next(&this->state);
      (this->currentSubpattern->paddingEndpoints).start = (this->state).offset;
      consumeLiteral(this,status);
      (this->currentSubpattern->paddingEndpoints).end = (this->state).offset;
    }
    else {
      ParserState::toParseException(&this->state,L"Cannot have multiple pad specifiers");
      *status = U_MULTIPLE_PAD_SPECIFIERS;
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumePadding(PadPosition paddingLocation, UErrorCode& status) {
    if (state.peek() != u'*') {
        return;
    }
    if (currentSubpattern->hasPadding) {
        state.toParseException(u"Cannot have multiple pad specifiers");
        status = U_MULTIPLE_PAD_SPECIFIERS;
        return;
    }
    currentSubpattern->paddingLocation = paddingLocation;
    currentSubpattern->hasPadding = true;
    state.next(); // consume the '*'
    currentSubpattern->paddingEndpoints.start = state.offset;
    consumeLiteral(status);
    currentSubpattern->paddingEndpoints.end = state.offset;
}